

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

StatisticObject __thiscall
Clasp::ClaspStatistics::findObject(ClaspStatistics *this,Key_t root,char *path,Key_t *res)

{
  Key_t *pKVar1;
  bool bVar2;
  Type TVar3;
  StatisticObject SVar4;
  char *pcVar5;
  Key_t KVar6;
  ulong __n;
  char *top;
  int pos;
  StatisticObject local_458;
  char *local_450;
  ClaspStatistics *local_448;
  Key_t *local_440;
  char temp [1024];
  
  local_448 = this;
  local_440 = res;
  SVar4 = getObject(this,root);
  local_458 = SVar4;
  TVar3 = StatisticObject::type(&local_458);
  local_450 = path;
  do {
    pKVar1 = local_440;
    if ((path == (char *)0x0) || (*path == '\0')) {
      if (local_440 != (Key_t *)0x0) {
        KVar6 = Impl::add(local_448->impl_,&local_458);
        *pKVar1 = KVar6;
        SVar4.handle_ = local_458.handle_;
      }
      return (StatisticObject)SVar4.handle_;
    }
    top = path;
    pcVar5 = strchr(path,0x2e);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      __n = (long)pcVar5 - (long)path;
      if (0x3ff < __n) {
        Potassco::fail(-1,
                       "StatisticObject Clasp::ClaspStatistics::findObject(Key_t, const char *, Key_t *) const"
                       ,0x15c,"len < 1024","invalid key",0);
      }
      pcVar5 = pcVar5 + 1;
      memcpy(temp,path,__n);
      temp[__n] = '\0';
      path = temp;
      top = temp;
    }
    if (TVar3.val_ == Array) {
      bVar2 = Potassco::match(&top,&pos);
      path = top;
      if ((!bVar2) || (pos < 0)) goto LAB_0016d2f6;
      SVar4 = StatisticObject::operator[](&local_458,pos);
    }
    else {
      if (TVar3.val_ != Map) {
LAB_0016d2f6:
        Potassco::fail(0x22,
                       "StatisticObject Clasp::ClaspStatistics::findObject(Key_t, const char *, Key_t *) const"
                       ,0x165,"false","invalid path: \'%s\' at key \'%s\'",local_450,path,0);
      }
      SVar4 = StatisticObject::at(&local_458,path);
    }
    local_458.handle_ = SVar4.handle_;
    TVar3 = StatisticObject::type(&local_458);
    path = pcVar5;
  } while( true );
}

Assistant:

StatisticObject ClaspStatistics::findObject(Key_t root, const char* path, Key_t* res) const {
	StatisticObject o = getObject(root);
	StatisticObject::Type t = o.type();
	char temp[1024]; const char* top, *parent = path;
	for (int pos; path && *path;) {
		top = path;
		if ((path = std::strchr(path, '.')) != 0) {
			std::size_t len = static_cast<std::size_t>(path++ - top);
			POTASSCO_ASSERT(len < 1024, "invalid key");
			top = (const char*)std::memcpy(temp, top, len);
			temp[len] = 0;
		}
		if      (t == Potassco::Statistics_t::Map) { o = o.at(top); }
		else if (t == Potassco::Statistics_t::Array && Potassco::match(top, pos) && pos >= 0) {
			o = o[uint32(pos)];
		}
		else {
			POTASSCO_CHECK(false, ERANGE, "invalid path: '%s' at key '%s'", parent, top);
		}
		t = o.type();
	}
	if (res) { *res = impl_->add(o); }
	return o;
}